

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network_conn.cpp
# Opt level: O2

int __thiscall
CNetConnection::Feed(CNetConnection *this,CNetPacketConstruct *pPacket,NETADDR_conflict *pAddr)

{
  uchar uVar1;
  ushort uVar2;
  ushort uVar3;
  TOKEN TVar4;
  long lVar5;
  undefined8 uVar6;
  uchar uVar7;
  uchar uVar8;
  uchar uVar9;
  uint uVar10;
  int iVar11;
  int64 iVar12;
  uint dst_size;
  int iVar13;
  int iVar14;
  char *fmt;
  long in_FS_OFFSET;
  char Str [128];
  
  lVar5 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = this->m_Sequence;
  uVar3 = this->m_PeerAck;
  iVar14 = pPacket->m_Ack;
  if (uVar2 < uVar3) {
    if (iVar14 < (int)(uint)uVar3 && (int)(uint)uVar2 < iVar14) {
LAB_00135c01:
      iVar14 = 0;
      goto LAB_00135e75;
    }
  }
  else if (iVar14 < (int)(uint)uVar3 || (int)(uint)uVar2 < iVar14) goto LAB_00135c01;
  this->m_PeerAck = (unsigned_short)iVar14;
  iVar12 = time_get();
  iVar13 = 0;
  iVar14 = 0;
  if ((pPacket->m_Token == 0xffffffff) || (pPacket->m_Token != this->m_Token)) goto LAB_00135e75;
  uVar10 = pPacket->m_Flags;
  if ((uVar10 & 2) != 0) {
    Resend(this);
    uVar10 = pPacket->m_Flags;
  }
  if ((uVar10 & 8) == 0) {
    if ((uVar10 & 1) == 0) {
      if (this->m_State == 3) {
        this->m_LastRecvTime = iVar12;
        this->m_State = 4;
        if (this->m_pNetBase->m_pConfig->m_Debug != 0) {
          fmt = "connecting online";
          goto LAB_00135be3;
        }
      }
    }
    else {
      uVar1 = pPacket->m_aChunkData[0];
      if (uVar1 == '\x05') {
        this->m_PeerToken = pPacket->m_ResponseToken;
        if (this->m_State == 1) {
          this->m_LastRecvTime = iVar12;
          this->m_State = 2;
          SendControlWithToken(this,1);
          dbg_msg("connection","got token, replying, token=%x mytoken=%x",(ulong)this->m_PeerToken,
                  (ulong)this->m_Token);
        }
        else if (this->m_pNetBase->m_pConfig->m_Debug != 0) {
          dbg_msg("connection","got token, token=%x");
        }
      }
      else {
        if (uVar1 == '\x04') {
          iVar11 = net_addr_comp((NETADDR *)&this->m_PeerAddr,(NETADDR *)pAddr,1);
          iVar14 = iVar13;
          if (iVar11 == 0) {
            this->m_State = 5;
            this->m_RemoteClosed = 1;
            Str[0x70] = '\0';
            Str[0x71] = '\0';
            Str[0x72] = '\0';
            Str[0x73] = '\0';
            Str[0x74] = '\0';
            Str[0x75] = '\0';
            Str[0x76] = '\0';
            Str[0x77] = '\0';
            Str[0x78] = '\0';
            Str[0x79] = '\0';
            Str[0x7a] = '\0';
            Str[0x7b] = '\0';
            Str[0x7c] = '\0';
            Str[0x7d] = '\0';
            Str[0x7e] = '\0';
            Str[0x7f] = '\0';
            Str[0x60] = '\0';
            Str[0x61] = '\0';
            Str[0x62] = '\0';
            Str[99] = '\0';
            Str[100] = '\0';
            Str[0x65] = '\0';
            Str[0x66] = '\0';
            Str[0x67] = '\0';
            Str[0x68] = '\0';
            Str[0x69] = '\0';
            Str[0x6a] = '\0';
            Str[0x6b] = '\0';
            Str[0x6c] = '\0';
            Str[0x6d] = '\0';
            Str[0x6e] = '\0';
            Str[0x6f] = '\0';
            Str[0x50] = '\0';
            Str[0x51] = '\0';
            Str[0x52] = '\0';
            Str[0x53] = '\0';
            Str[0x54] = '\0';
            Str[0x55] = '\0';
            Str[0x56] = '\0';
            Str[0x57] = '\0';
            Str[0x58] = '\0';
            Str[0x59] = '\0';
            Str[0x5a] = '\0';
            Str[0x5b] = '\0';
            Str[0x5c] = '\0';
            Str[0x5d] = '\0';
            Str[0x5e] = '\0';
            Str[0x5f] = '\0';
            Str[0x40] = '\0';
            Str[0x41] = '\0';
            Str[0x42] = '\0';
            Str[0x43] = '\0';
            Str[0x44] = '\0';
            Str[0x45] = '\0';
            Str[0x46] = '\0';
            Str[0x47] = '\0';
            Str[0x48] = '\0';
            Str[0x49] = '\0';
            Str[0x4a] = '\0';
            Str[0x4b] = '\0';
            Str[0x4c] = '\0';
            Str[0x4d] = '\0';
            Str[0x4e] = '\0';
            Str[0x4f] = '\0';
            Str[0x30] = '\0';
            Str[0x31] = '\0';
            Str[0x32] = '\0';
            Str[0x33] = '\0';
            Str[0x34] = '\0';
            Str[0x35] = '\0';
            Str[0x36] = '\0';
            Str[0x37] = '\0';
            Str[0x38] = '\0';
            Str[0x39] = '\0';
            Str[0x3a] = '\0';
            Str[0x3b] = '\0';
            Str[0x3c] = '\0';
            Str[0x3d] = '\0';
            Str[0x3e] = '\0';
            Str[0x3f] = '\0';
            Str[0x20] = '\0';
            Str[0x21] = '\0';
            Str[0x22] = '\0';
            Str[0x23] = '\0';
            Str[0x24] = '\0';
            Str[0x25] = '\0';
            Str[0x26] = '\0';
            Str[0x27] = '\0';
            Str[0x28] = '\0';
            Str[0x29] = '\0';
            Str[0x2a] = '\0';
            Str[0x2b] = '\0';
            Str[0x2c] = '\0';
            Str[0x2d] = '\0';
            Str[0x2e] = '\0';
            Str[0x2f] = '\0';
            Str[0x10] = '\0';
            Str[0x11] = '\0';
            Str[0x12] = '\0';
            Str[0x13] = '\0';
            Str[0x14] = '\0';
            Str[0x15] = '\0';
            Str[0x16] = '\0';
            Str[0x17] = '\0';
            Str[0x18] = '\0';
            Str[0x19] = '\0';
            Str[0x1a] = '\0';
            Str[0x1b] = '\0';
            Str[0x1c] = '\0';
            Str[0x1d] = '\0';
            Str[0x1e] = '\0';
            Str[0x1f] = '\0';
            Str[0] = '\0';
            Str[1] = '\0';
            Str[2] = '\0';
            Str[3] = '\0';
            Str[4] = '\0';
            Str[5] = '\0';
            Str[6] = '\0';
            Str[7] = '\0';
            Str[8] = '\0';
            Str[9] = '\0';
            Str[10] = '\0';
            Str[0xb] = '\0';
            Str[0xc] = '\0';
            Str[0xd] = '\0';
            Str[0xe] = '\0';
            Str[0xf] = '\0';
            uVar10 = pPacket->m_DataSize;
            if (1 < (int)uVar10) {
              dst_size = 0x80;
              if (uVar10 < 0x80) {
                dst_size = uVar10;
              }
              str_copy(Str,(char *)(pPacket->m_aChunkData + 1),dst_size);
              str_sanitize_strong(Str);
            }
            if (this->m_BlockCloseMsg == false) {
              SetError(this,Str);
            }
            if (this->m_pNetBase->m_pConfig->m_Debug != 0) {
              dbg_msg("conn","closed reason=\'%s\'",Str);
            }
          }
          goto LAB_00135e75;
        }
        if (this->m_State == 0) {
          if (uVar1 == '\x01') {
            TVar4 = this->m_Token;
            Reset(this);
            mem_zero(this->m_ErrorString,0x100);
            this->m_State = 3;
            uVar1 = pAddr->ip[0];
            uVar7 = pAddr->ip[1];
            uVar8 = pAddr->ip[2];
            uVar9 = pAddr->ip[3];
            uVar6 = *(undefined8 *)(pAddr->ip + 4);
            (this->m_PeerAddr).type = pAddr->type;
            (this->m_PeerAddr).ip[0] = uVar1;
            (this->m_PeerAddr).ip[1] = uVar7;
            (this->m_PeerAddr).ip[2] = uVar8;
            (this->m_PeerAddr).ip[3] = uVar9;
            *(undefined8 *)((this->m_PeerAddr).ip + 4) = uVar6;
            *(undefined8 *)((this->m_PeerAddr).ip + 0xc) = *(undefined8 *)(pAddr->ip + 0xc);
            this->m_PeerToken = pPacket->m_ResponseToken;
            this->m_Token = TVar4;
            this->m_LastSendTime = iVar12;
            this->m_LastRecvTime = iVar12;
            this->m_LastUpdateTime = iVar12;
            SendControl(this,2,(void *)0x0,0);
            if (this->m_pNetBase->m_pConfig->m_Debug != 0) {
              fmt = "got connection, sending accept";
              goto LAB_00135be3;
            }
          }
        }
        else if (uVar1 == '\x02' && this->m_State == 2) {
          this->m_LastRecvTime = iVar12;
          this->m_State = 4;
          if (this->m_pNetBase->m_pConfig->m_Debug != 0) {
            fmt = "got accept. connection online";
LAB_00135be3:
            dbg_msg("connection",fmt);
          }
        }
      }
    }
    if (this->m_State == 4) {
      this->m_LastRecvTime = iVar12;
      AckChunks(this,pPacket->m_Ack);
    }
  }
  iVar14 = 1;
LAB_00135e75:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar5) {
    return iVar14;
  }
  __stack_chk_fail();
}

Assistant:

int CNetConnection::Feed(CNetPacketConstruct *pPacket, NETADDR *pAddr)
{
	// check if actual ack value is valid(own sequence..latest peer ack)
	if(m_Sequence >= m_PeerAck)
	{
		if(pPacket->m_Ack < m_PeerAck || pPacket->m_Ack > m_Sequence)
			return 0;
	}
	else
	{
		if(pPacket->m_Ack < m_PeerAck && pPacket->m_Ack > m_Sequence)
			return 0;
	}
	m_PeerAck = pPacket->m_Ack;

	int64 Now = time_get();

	if(pPacket->m_Token == NET_TOKEN_NONE || pPacket->m_Token != m_Token)
		return 0;

	// check if resend is requested
	if(pPacket->m_Flags&NET_PACKETFLAG_RESEND)
		Resend();

	if(pPacket->m_Flags&NET_PACKETFLAG_CONNLESS)
		return 1;

	//
	if(pPacket->m_Flags&NET_PACKETFLAG_CONTROL)
	{
		int CtrlMsg = pPacket->m_aChunkData[0];

		if(CtrlMsg == NET_CTRLMSG_CLOSE)
		{
			if(net_addr_comp(&m_PeerAddr, pAddr, true) == 0)
			{
				m_State = NET_CONNSTATE_ERROR;
				m_RemoteClosed = 1;

				char Str[128] = {0};
				if(pPacket->m_DataSize > 1)
				{
					// make sure to sanitize the error string form the other party
					if(pPacket->m_DataSize < 128)
						str_copy(Str, (char *)&pPacket->m_aChunkData[1], pPacket->m_DataSize);
					else
						str_copy(Str, (char *)&pPacket->m_aChunkData[1], sizeof(Str));
					str_sanitize_strong(Str);
				}

				if(!m_BlockCloseMsg)
				{
					// set the error string
					SetError(Str);
				}

				if(Config()->m_Debug)
					dbg_msg("conn", "closed reason='%s'", Str);
			}
			return 0;
		}
		else
		{
			if(CtrlMsg == NET_CTRLMSG_TOKEN)
			{
				m_PeerToken = pPacket->m_ResponseToken;

				if(State() == NET_CONNSTATE_TOKEN)
				{
					m_LastRecvTime = Now;
					m_State = NET_CONNSTATE_CONNECT;
					SendControlWithToken(NET_CTRLMSG_CONNECT);
					dbg_msg("connection", "got token, replying, token=%x mytoken=%x", m_PeerToken, m_Token);
				}
				else if(Config()->m_Debug)
					dbg_msg("connection", "got token, token=%x", m_PeerToken);
			}
			else
			{
				if(State() == NET_CONNSTATE_OFFLINE)
				{
					if(CtrlMsg == NET_CTRLMSG_CONNECT)
					{
						// send response and init connection
						TOKEN Token = m_Token;
						Reset();
						mem_zero(m_ErrorString, sizeof(m_ErrorString));
						m_State = NET_CONNSTATE_PENDING;
						m_PeerAddr = *pAddr;
						m_PeerToken = pPacket->m_ResponseToken;
						m_Token = Token;
						m_LastSendTime = Now;
						m_LastRecvTime = Now;
						m_LastUpdateTime = Now;
						SendControl(NET_CTRLMSG_ACCEPT, 0, 0);
						if(Config()->m_Debug)
							dbg_msg("connection", "got connection, sending accept");
					}
				}
				else if(State() == NET_CONNSTATE_CONNECT)
				{
					// connection made
					if(CtrlMsg == NET_CTRLMSG_ACCEPT)
					{
						m_LastRecvTime = Now;
						m_State = NET_CONNSTATE_ONLINE;
						if(Config()->m_Debug)
							dbg_msg("connection", "got accept. connection online");
					}
				}
			}
		}
	}
	else
	{
		if(State() == NET_CONNSTATE_PENDING)
		{
			m_LastRecvTime = Now;
			m_State = NET_CONNSTATE_ONLINE;
			if(Config()->m_Debug)
				dbg_msg("connection", "connecting online");
		}
	}

	if(State() == NET_CONNSTATE_ONLINE)
	{
		m_LastRecvTime = Now;
		AckChunks(pPacket->m_Ack);
	}

	return 1;
}